

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O0

void __thiscall duckdb::SQLStatement::~SQLStatement(SQLStatement *this)

{
  code *pcVar1;
  SQLStatement *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SQLStatement() {
	}